

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::PrepareInputBuffer(FunctionalTest *this)

{
  GLvoid *pGVar1;
  int iVar2;
  GLint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *pvVar6;
  undefined4 *puVar7;
  GLvoid *is_p;
  undefined1 local_1a0 [384];
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x3b8))(1,&this->m_bo_in);
  iVar2 = (**(code **)(lVar5 + 0x800))();
  if (iVar2 == 0) {
    (*this->m_pNamedBufferStorage)(this->m_bo_in,0x18,s_initial_data_a,0x142);
    iVar2 = (**(code **)(lVar5 + 0x800))();
    if (iVar2 == 0) {
      (*this->m_pClearNamedBufferSubData)
                (this->m_bo_in,0x8229,0,4,0x1903,0x1404,&PrepareInputBuffer::zero);
      iVar2 = (**(code **)(lVar5 + 0x800))();
      if (iVar2 == 0) {
        (*this->m_pNamedBufferSubData)(this->m_bo_in,4,4,&PrepareInputBuffer::one);
        iVar2 = (**(code **)(lVar5 + 0x800))();
        if (iVar2 == 0) {
          pvVar6 = (*this->m_pMapNamedBuffer)(this->m_bo_in,0x88b9);
          iVar2 = (**(code **)(lVar5 + 0x800))();
          if ((pvVar6 == (void *)0x0) || (iVar2 == 0)) {
            *(undefined4 *)((long)pvVar6 + 8) = 2;
            (*this->m_pUnmapNamedBuffer)(this->m_bo_in);
            iVar2 = (**(code **)(lVar5 + 0x800))();
            if (iVar2 == 0) {
              (*this->m_pCopyNamedBufferSubData)(this->m_bo_in,this->m_bo_in,0xc,0x10,4);
              iVar2 = (**(code **)(lVar5 + 0x800))();
              if (iVar2 == 0) {
                puVar7 = (undefined4 *)(*this->m_pMapNamedBufferRange)(this->m_bo_in,0xc,4,0x52);
                iVar2 = (**(code **)(lVar5 + 0x800))();
                if (iVar2 == 0) {
                  *puVar7 = 3;
                  (*this->m_pFlushMappedNamedBufferRange)(this->m_bo_in,0,4);
                  iVar2 = (**(code **)(lVar5 + 0x800))();
                  if (iVar2 == 0) {
                    is_p = (GLvoid *)0x0;
                    (*this->m_pGetNamedBufferPointerv)(this->m_bo_in,0x88bd,&is_p);
                    iVar2 = (**(code **)(lVar5 + 0x800))();
                    pGVar1 = is_p;
                    if (iVar2 == 0) {
                      (*this->m_pUnmapNamedBuffer)(this->m_bo_in);
                      if (puVar7 == (undefined4 *)pGVar1) {
                        iVar2 = (**(code **)(lVar5 + 0x800))();
                        if (iVar2 == 0) {
                          GVar3 = (**(code **)(lVar5 + 0x780))(this->m_po,"data_in");
                          this->m_attrib_location = GVar3;
                          dVar4 = (**(code **)(lVar5 + 0x800))();
                          glu::checkError(dVar4,"glGetAttribLocation call failed.",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                                          ,0x15d1);
                          (**(code **)(lVar5 + 0x40))(0x8892,this->m_bo_in);
                          dVar4 = (**(code **)(lVar5 + 0x800))();
                          glu::checkError(dVar4,"glBindBuffer call failed.",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                                          ,0x15d4);
                          (**(code **)(lVar5 + 0x1958))(this->m_attrib_location,1,0x1404,0,0);
                          dVar4 = (**(code **)(lVar5 + 0x800))();
                          glu::checkError(dVar4,"glVertexAttribIPointer call failed.",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                                          ,0x15d8);
                          (**(code **)(lVar5 + 0x610))(this->m_attrib_location);
                          dVar4 = (**(code **)(lVar5 + 0x800))();
                          glu::checkError(dVar4,"glEnableVertexAttribArray call failed.",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                                          ,0x15dc);
                          return true;
                        }
                        local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8))
                        ;
                        std::operator<<((ostream *)(local_1a0 + 8),"UnmapNamedBuffer has failed.");
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1a0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
                      }
                      else {
                        local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8))
                        ;
                        std::operator<<((ostream *)(local_1a0 + 8),
                                        "Pointer returned by GetNamedBufferPointerv is not proper.")
                        ;
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1a0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
                      }
                    }
                    else {
                      (*this->m_pUnmapNamedBuffer)(this->m_bo_in);
                      local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
                      std::operator<<((ostream *)(local_1a0 + 8),
                                      "GetNamedBufferPointerv has failed.");
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1a0,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
                    }
                  }
                  else {
                    (*this->m_pUnmapNamedBuffer)(this->m_bo_in);
                    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
                    std::operator<<((ostream *)(local_1a0 + 8),
                                    "FlushMappedNamedBufferRange has failed.");
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1a0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                  }
                }
                else {
                  local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
                  std::operator<<((ostream *)(local_1a0 + 8),"MapNamedBufferRange has failed.");
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1a0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                }
              }
              else {
                local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
                std::operator<<((ostream *)(local_1a0 + 8),"CopyNamedBufferSubData has failed.");
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
              }
            }
            else {
              local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
              std::operator<<((ostream *)(local_1a0 + 8),"UnmapNamedBuffer has failed.");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
          }
          else {
            local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
            std::operator<<((ostream *)(local_1a0 + 8),"MapNamedBuffer has failed.");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
        }
        else {
          local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
          std::operator<<((ostream *)(local_1a0 + 8),"NamedBufferSubData has failed.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
      }
      else {
        local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
        std::operator<<((ostream *)(local_1a0 + 8),"ClearNamedBufferSubData has failed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
      std::operator<<((ostream *)(local_1a0 + 8),"NamedBufferStorage has failed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
    std::operator<<((ostream *)(local_1a0 + 8),"CreateBuffers has failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 8));
  return false;
}

Assistant:

bool FunctionalTest::PrepareInputBuffer()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Constants. */
	static const glw::GLint zero = 0;
	static const glw::GLint one  = 1;

	/* Buffer preparation */
	gl.createBuffers(1, &m_bo_in);

	if (GL_NO_ERROR == gl.getError())
	{
		/* Storage and last (6th) element preparation. */
		m_pNamedBufferStorage(m_bo_in, sizeof(s_initial_data_a), s_initial_data_a,
							  GL_MAP_WRITE_BIT | GL_DYNAMIC_STORAGE_BIT | GL_MAP_PERSISTENT_BIT);

		if (GL_NO_ERROR == gl.getError())
		{
			/* First element preparation. */
			m_pClearNamedBufferSubData(m_bo_in, GL_R8, 0, sizeof(glw::GLint), GL_RED, GL_INT, &zero);

			if (GL_NO_ERROR == gl.getError())
			{
				/* Second element preparation. */
				m_pNamedBufferSubData(m_bo_in, 1 /* 2nd element */ * sizeof(glw::GLint), sizeof(glw::GLint), &one);

				if (GL_NO_ERROR == gl.getError())
				{
					/* Third element preparation. */
					glw::GLint* p = (glw::GLint*)m_pMapNamedBuffer(m_bo_in, GL_WRITE_ONLY);

					if ((GL_NO_ERROR == gl.getError()) || (DE_NULL == p))
					{
						p[2] = 2;

						m_pUnmapNamedBuffer(m_bo_in);

						if (GL_NO_ERROR == gl.getError())
						{
							/* Fifth element preparation. */
							m_pCopyNamedBufferSubData(m_bo_in, m_bo_in, sizeof(glw::GLint) * 3, sizeof(glw::GLint) * 4,
													  sizeof(glw::GLint));

							if (GL_NO_ERROR == gl.getError())
							{
								/* Fourth element preparation. */
								p = (glw::GLint*)m_pMapNamedBufferRange(
									m_bo_in, sizeof(glw::GLint) * 3, sizeof(glw::GLint),
									GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);

								if (GL_NO_ERROR == gl.getError())
								{
									/* Write to mapped buffer. */
									*p = 3;

									/* Flush test. */
									m_pFlushMappedNamedBufferRange(m_bo_in, 0, sizeof(glw::GLint));

									if (GL_NO_ERROR == gl.getError())
									{
										/* Mapped Buffer Pointer query. */
										glw::GLvoid* is_p = DE_NULL;
										m_pGetNamedBufferPointerv(m_bo_in, GL_BUFFER_MAP_POINTER, &is_p);

										if (GL_NO_ERROR == gl.getError())
										{
											/* Mapped Buffer pointer query check. */
											if (p == is_p)
											{
												/* Unmapping. */
												m_pUnmapNamedBuffer(m_bo_in);

												if (GL_NO_ERROR == gl.getError())
												{
													/* Setup buffer as input for vertex shader. */
													m_attrib_location =
														gl.getAttribLocation(m_po, s_vertex_shader_input_name);
													GLU_EXPECT_NO_ERROR(gl.getError(),
																		"glGetAttribLocation call failed.");

													gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_in);
													GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

													gl.vertexAttribIPointer(m_attrib_location, 1, GL_INT, 0, NULL);
													GLU_EXPECT_NO_ERROR(gl.getError(),
																		"glVertexAttribIPointer call failed.");

													gl.enableVertexAttribArray(m_attrib_location);
													GLU_EXPECT_NO_ERROR(gl.getError(),
																		"glEnableVertexAttribArray call failed.");

													return true;
												}
												else
												{
													m_context.getTestContext().getLog()
														<< tcu::TestLog::Message << "UnmapNamedBuffer has failed."
														<< tcu::TestLog::EndMessage;
												}
											}
											else
											{
												m_pUnmapNamedBuffer(m_bo_in);
												m_context.getTestContext().getLog()
													<< tcu::TestLog::Message
													<< "Pointer returned by GetNamedBufferPointerv is not proper."
													<< tcu::TestLog::EndMessage;
											}
										}
										else
										{
											m_pUnmapNamedBuffer(m_bo_in);
											m_context.getTestContext().getLog() << tcu::TestLog::Message
																				<< "GetNamedBufferPointerv has failed."
																				<< tcu::TestLog::EndMessage;
										}
									}
									else
									{
										m_pUnmapNamedBuffer(m_bo_in);
										m_context.getTestContext().getLog() << tcu::TestLog::Message
																			<< "FlushMappedNamedBufferRange has failed."
																			<< tcu::TestLog::EndMessage;
									}
								}
								else
								{
									m_context.getTestContext().getLog() << tcu::TestLog::Message
																		<< "MapNamedBufferRange has failed."
																		<< tcu::TestLog::EndMessage;
								}
							}
							else
							{
								m_context.getTestContext().getLog() << tcu::TestLog::Message
																	<< "CopyNamedBufferSubData has failed."
																	<< tcu::TestLog::EndMessage;
							}
						}
						else
						{
							m_context.getTestContext().getLog()
								<< tcu::TestLog::Message << "UnmapNamedBuffer has failed." << tcu::TestLog::EndMessage;
						}
					}
					else
					{
						m_context.getTestContext().getLog() << tcu::TestLog::Message << "MapNamedBuffer has failed."
															<< tcu::TestLog::EndMessage;
					}
				}
				else
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "NamedBufferSubData has failed."
														<< tcu::TestLog::EndMessage;
				}
			}
			else
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "ClearNamedBufferSubData has failed."
													<< tcu::TestLog::EndMessage;
			}
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "NamedBufferStorage has failed."
												<< tcu::TestLog::EndMessage;
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "CreateBuffers has failed."
											<< tcu::TestLog::EndMessage;
	}

	return false;
}